

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side1_8d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  double dVar43;
  undefined1 auVar42 [16];
  double dVar44;
  
  dVar20 = *p0;
  dVar39 = p0[3];
  dVar10 = dVar39 - p1[3];
  dVar1 = p0[4];
  dVar2 = p0[5];
  dVar41 = dVar1 - p1[4];
  dVar43 = dVar2 - p1[5];
  dVar19 = p1[3] - dVar39;
  dVar3 = p0[1];
  dVar4 = p0[2];
  dVar21 = dVar3 - p1[1];
  dVar25 = dVar4 - p1[2];
  dVar28 = ABS(dVar25);
  if (ABS(dVar25) <= ABS(dVar21)) {
    dVar28 = ABS(dVar21);
  }
  dVar33 = *p1 - dVar20;
  dVar34 = dVar20 - *p1;
  dVar27 = ABS(dVar33);
  auVar29._8_8_ = ABS(dVar34);
  auVar35._8_4_ = SUB84(dVar27,0);
  auVar35._0_8_ = auVar29._8_8_;
  auVar35._12_4_ = (int)((ulong)dVar27 >> 0x20);
  auVar36._8_4_ = SUB84(dVar28,0);
  auVar36._0_8_ = dVar28;
  auVar36._12_4_ = (int)((ulong)dVar28 >> 0x20);
  auVar36 = maxpd(auVar35,auVar36);
  auVar29._0_8_ = ABS(dVar10);
  auVar36 = maxpd(auVar29,auVar36);
  dVar37 = p1[1] - dVar3;
  auVar42._0_8_ = ABS(dVar43);
  auVar42._8_8_ = ABS(dVar41);
  auVar14._8_8_ = ABS(dVar10);
  auVar14._0_8_ = auVar42._8_8_;
  auVar36 = maxpd(auVar14,auVar36);
  dVar27 = p0[6];
  dVar5 = p0[7];
  dVar11 = dVar27 - p1[6];
  dVar12 = dVar5 - p1[7];
  dVar28 = ABS(dVar11);
  auVar30._8_8_ = ABS(dVar12);
  auVar31._8_8_ = auVar42._0_8_;
  auVar31._0_8_ = dVar28;
  auVar36 = maxpd(auVar42,auVar36);
  auVar36 = maxpd(auVar31,auVar36);
  auVar15._8_4_ = SUB84(dVar28,0);
  auVar15._0_8_ = auVar30._8_8_;
  auVar15._12_4_ = (int)((ulong)dVar28 >> 0x20);
  auVar36 = maxpd(auVar15,auVar36);
  auVar30._0_8_ = ABS(*q0 - dVar20);
  auVar36 = maxpd(auVar30,auVar36);
  auVar16._0_8_ = ABS(q0[1] - dVar3);
  auVar16._8_8_ = ABS(dVar37);
  auVar36 = maxpd(auVar16,auVar36);
  dVar32 = p1[2] - dVar4;
  auVar40._0_8_ = ABS(q0[2] - dVar4);
  auVar40._8_8_ = ABS(dVar32);
  auVar36 = maxpd(auVar40,auVar36);
  dVar44 = p1[4] - dVar1;
  dVar13 = p1[5] - dVar2;
  dVar38 = p1[6] - dVar27;
  dVar28 = p1[7] - dVar5;
  auVar17._0_8_ = ABS(q0[3] - dVar39);
  auVar17._8_8_ = ABS(dVar19);
  auVar36 = maxpd(auVar17,auVar36);
  auVar23._0_8_ = ABS(q0[4] - dVar1);
  auVar23._8_8_ = ABS(dVar44);
  auVar36 = maxpd(auVar23,auVar36);
  auVar18._0_8_ = ABS(q0[5] - dVar2);
  auVar18._8_8_ = ABS(dVar13);
  auVar36 = maxpd(auVar18,auVar36);
  auVar24._0_8_ = ABS(q0[6] - dVar27);
  auVar24._8_8_ = ABS(dVar38);
  auVar36 = maxpd(auVar24,auVar36);
  auVar8._0_8_ = ABS(q0[7] - dVar5);
  auVar8._8_8_ = ABS(dVar28);
  auVar36 = maxpd(auVar8,auVar36);
  dVar7 = auVar36._0_8_;
  dVar9 = auVar36._8_8_;
  dVar22 = dVar9;
  dVar26 = dVar7;
  if ((dVar9 <= dVar7) && (dVar26 = dVar9, dVar9 < dVar7)) {
    dVar22 = dVar7;
  }
  iVar6 = 0;
  if ((1.1554293109153009e-147 <= dVar26) && (dVar22 <= 5.599361855444509e+101)) {
    dVar20 = dVar28 * (q0[7] - dVar5) +
             dVar38 * (q0[6] - dVar27) +
             dVar13 * (q0[5] - dVar2) +
             dVar44 * (q0[4] - dVar1) +
             dVar19 * (q0[3] - dVar39) +
             dVar32 * (q0[2] - dVar4) + (*q0 - dVar20) * dVar33 + dVar37 * (q0[1] - dVar3);
    dVar39 = dVar9 * dVar7 * 1.6667009016668223e-14;
    dVar20 = (dVar12 * dVar12 +
             dVar11 * dVar11 +
             dVar43 * dVar43 +
             dVar41 * dVar41 + dVar10 * dVar10 + dVar25 * dVar25 + dVar34 * dVar34 + dVar21 * dVar21
             ) - (dVar20 + dVar20);
    iVar6 = 1;
    if ((dVar20 <= dVar39) && (iVar6 = 0, dVar20 < -dVar39)) {
      iVar6 = -1;
    }
  }
  return iVar6;
}

Assistant:

inline int side1_8d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double p0_4_p1_4 = (p0[4] - p1[4]);
    double p0_5_p1_5 = (p0[5] - p1[5]);
    double p0_6_p1_6 = (p0[6] - p1[6]);
    double p0_7_p1_7 = (p0[7] - p1[7]);
    double r;
    r = (1 * ((((((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)) + (p0_4_p1_4 * p0_4_p1_4)) + (p0_5_p1_5 * p0_5_p1_5)) + (p0_6_p1_6 * p0_6_p1_6)) + (p0_7_p1_7 * p0_7_p1_7)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    r = (r - (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0_1_p1_1);
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p0_0_p1_0)) )
    {
        max1 = fabs(p0_0_p1_0);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p0_4_p1_4)) )
    {
        max1 = fabs(p0_4_p1_4);
    } 
    if( (max1 < fabs(p0_5_p1_5)) )
    {
        max1 = fabs(p0_5_p1_5);
    } 
    if( (max1 < fabs(p0_6_p1_6)) )
    {
        max1 = fabs(p0_6_p1_6);
    } 
    if( (max1 < fabs(p0_7_p1_7)) )
    {
        max1 = fabs(p0_7_p1_7);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    double max2 = fabs(p0_1_p1_1);
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_0_p1_0)) )
    {
        max2 = fabs(p0_0_p1_0);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(p0_4_p1_4)) )
    {
        max2 = fabs(p0_4_p1_4);
    } 
    if( (max2 < fabs(p0_5_p1_5)) )
    {
        max2 = fabs(p0_5_p1_5);
    } 
    if( (max2 < fabs(p0_6_p1_6)) )
    {
        max2 = fabs(p0_6_p1_6);
    } 
    if( (max2 < fabs(p0_7_p1_7)) )
    {
        max2 = fabs(p0_7_p1_7);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}